

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O0

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
::Video(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
        *this,VideoBusHandler *bus_handler)

{
  anon_class_8_1_8991fb9c local_40;
  function<void_(Cycles)> local_38;
  VideoBusHandler *local_18;
  VideoBusHandler *bus_handler_local;
  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
  *this_local;
  
  local_40.this = this;
  local_18 = bus_handler;
  bus_handler_local = (VideoBusHandler *)this;
  std::function<void(Cycles)>::
  function<Apple::II::Video::Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,false>::VideoBusHandler,false>::Video(Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,false>::VideoBusHandler&)::_lambda(Cycles)_1_,void>
            ((function<void(Cycles)> *)&local_38,&local_40);
  VideoBase::VideoBase(&this->super_VideoBase,false,&local_38);
  std::function<void_(Cycles)>::~function(&local_38);
  this->bus_handler_ = local_18;
  return;
}

Assistant:

Video(BusHandler &bus_handler) :
			VideoBase(is_iie, [this] (Cycles cycles) { advance(cycles); }),
			bus_handler_(bus_handler) {}